

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMDocumentImpl::callUserDataHandlers
          (DOMDocumentImpl *this,DOMNodeImpl *n,DOMOperationType operation,DOMNode *src,DOMNode *dst
          )

{
  uint uVar1;
  DOMUserDataHandler *pDVar2;
  XMLSize_t getAt;
  int iVar3;
  undefined4 extraout_var;
  uint *puVar4;
  RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
  *pRVar5;
  KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *pKVar6;
  IllegalArgumentException *this_00;
  RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
  *pRVar7;
  int key2;
  ValueVectorOf<int> snapshot;
  ValueVectorEnumerator<int> snapshotEnum;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  userDataEnum;
  int local_c4;
  ValueVectorOf<int> local_c0;
  ValueVectorEnumerator<int> local_98;
  DOMNode *local_78;
  DOMNode *local_70;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  local_68;
  
  if (this->fUserDataTable !=
      (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
       *)0x0) {
    local_78 = src;
    local_70 = dst;
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::RefHash2KeysTableOfEnumerator(&local_68,this->fUserDataTable,false,this->fMemoryManager);
    local_68.fLockPrimaryKey = n;
    (*local_68.super_XMLEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>.
      _vptr_XMLEnumerator[4])(&local_68);
    local_c0.fMemoryManager = this->fMemoryManager;
    local_c0.fCallDestructor = false;
    local_c0.fCurCount = 0;
    local_c0.fMaxCount = 3;
    local_c0.fElemList = (int *)0x0;
    iVar3 = (*(local_c0.fMemoryManager)->_vptr_MemoryManager[3])();
    local_c0.fElemList = (int *)CONCAT44(extraout_var,iVar3);
    memset(local_c0.fElemList,0,local_c0.fMaxCount << 2);
    while ((local_68.fCurElem !=
            (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
             *)0x0 || (local_68.fCurHash != (local_68.fToEnum)->fHashModulus))) {
      RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
      ::nextElementKey(&local_68,(void **)&local_98,&local_c4);
      ValueVectorOf<int>::ensureExtraCapacity(&local_c0,1);
      local_c0.fElemList[local_c0.fCurCount] = local_c4;
      local_c0.fCurCount = local_c0.fCurCount + 1;
    }
    local_98.super_XMLEnumerator<int>._vptr_XMLEnumerator =
         (_func_int **)&PTR__ValueVectorEnumerator_0040fbf8;
    local_98.fAdopted = false;
    local_98.fCurIndex = 0;
    local_98.fToEnum = &local_c0;
    if (local_c0.fCurCount != 0) {
      local_98.fCurIndex = 0;
      do {
        getAt = local_98.fCurIndex;
        local_98.fCurIndex = local_98.fCurIndex + 1;
        puVar4 = (uint *)ValueVectorOf<int>::elementAt(local_98.fToEnum,getAt);
        uVar1 = *puVar4;
        pRVar5 = this->fUserDataTable->fBucketList[(ulong)n % this->fUserDataTable->fHashModulus];
        pRVar7 = (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                  *)0x0;
        if (pRVar5 != (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                       *)0x0) {
          do {
            if ((pRVar5->fKey2 == uVar1) && (pRVar7 = pRVar5, (DOMNodeImpl *)pRVar5->fKey1 == n))
            goto LAB_0026ccff;
            pRVar5 = pRVar5->fNext;
          } while (pRVar5 != (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                              *)0x0);
          pRVar7 = (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                    *)0x0;
        }
LAB_0026ccff:
        if (pRVar7 == (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                       *)0x0) {
          pKVar6 = (KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)0x0;
        }
        else {
          pKVar6 = pRVar7->fData;
        }
        pDVar2 = pKVar6->fValue;
        if (pDVar2 != (DOMUserDataHandler *)0x0) {
          if (((ulong)uVar1 == 0) || ((this->fUserDataTableKeys).fCurId <= uVar1)) {
            this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x30);
            IllegalArgumentException::IllegalArgumentException
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/StringPool.hpp"
                       ,0xa2,StrPool_IllegalId,(this->fUserDataTableKeys).fMemoryManager);
            __cxa_throw(this_00,&IllegalArgumentException::typeinfo,XMLException::~XMLException);
          }
          (**(code **)(*(long *)pDVar2 + 0x10))
                    (pDVar2,operation,(this->fUserDataTableKeys).fIdMap[uVar1]->fString,pKVar6->fKey
                     ,local_78,local_70);
        }
      } while (local_98.fCurIndex < (local_98.fToEnum)->fCurCount);
    }
    if (operation == NODE_DELETED) {
      RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
      ::removeKey(this->fUserDataTable,n);
    }
    ValueVectorEnumerator<int>::~ValueVectorEnumerator(&local_98);
    (*(local_c0.fMemoryManager)->_vptr_MemoryManager[4])(local_c0.fMemoryManager,local_c0.fElemList)
    ;
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::~RefHash2KeysTableOfEnumerator(&local_68);
  }
  return;
}

Assistant:

void DOMDocumentImpl::callUserDataHandlers(const DOMNodeImpl* n, DOMUserDataHandler::DOMOperationType operation, const DOMNode* src, DOMNode* dst) const
{
    if (fUserDataTable) {
        RefHash2KeysTableOfEnumerator<DOMUserDataRecord, PtrHasher> userDataEnum(fUserDataTable, false, fMemoryManager);
        userDataEnum.setPrimaryKey(n);
        // Create a snapshot of the handlers to be called, as the "handle" callback could be invalidating the enumerator by calling
        // setUserData on the dst node
        ValueVectorOf< int > snapshot(3, fMemoryManager);
        while (userDataEnum.hasMoreElements()) {
            // get the key
            void* key;
            int key2;
            userDataEnum.nextElementKey(key,key2);
            snapshot.addElement(key2);
        }
        ValueVectorEnumerator< int > snapshotEnum(&snapshot);
        while(snapshotEnum.hasMoreElements())
        {
            int key2=snapshotEnum.nextElement();

            // get the DOMUserDataRecord
            DOMUserDataRecord* userDataRecord = fUserDataTable->get((void*)n,key2);

            // get the handler
            DOMUserDataHandler* handler = userDataRecord->getValue();

            if (handler) {
                // get the data
                void* data = userDataRecord->getKey();
                const XMLCh* userKey = fUserDataTableKeys.getValueForId(key2);
                handler->handle(operation, userKey, data, src, dst);
            }
        }
        // if the operation is NODE_DELETED, we in fact should remove the data from the table
        if (operation == DOMUserDataHandler::NODE_DELETED)
            fUserDataTable->removeKey((void*)n);
    }
}